

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_mfcc.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  uchar *puVar2;
  ostream *poVar3;
  int64_t iVar4;
  int64_t etime2;
  Mat_<double> mel2;
  int64_t etime;
  Mat_<double> mel;
  int64_t stime;
  undefined1 local_260 [2] [16];
  long local_240;
  fstream ifile;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> ifile_data;
  unsigned_long ifile_length;
  
  ifile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::fstream::fstream(&local_240,"/home/toson/CLionProjects/MFCC/y.bin",_S_in);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_240 + *(long *)(local_240 + -0x18)));
  if (bVar1) {
    std::istream::seekg((long)&local_240,_S_beg);
    local_260[0] = std::istream::tellg();
    ifile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::fpos::operator_cast_to_long((fpos *)local_260);
    std::istream::seekg((long)&local_240,_S_beg);
    stime._7_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
               (size_type)
               ifile_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(value_type_conflict2 *)((long)&stime + 7))
    ;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    std::istream::read((char *)&local_240,(long)puVar2);
    std::fstream::close();
    mel._88_8_ = NowTime<std::chrono::duration<long,std::ratio<1l,1000l>>>();
    pcen((Mat_<double> *)&etime,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
         16000);
    mel2._88_8_ = NowTime<std::chrono::duration<long,std::ratio<1l,1000l>>>();
    poVar3 = std::operator<<((ostream *)&std::cout,"all cost: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,mel2._88_8_ - mel._88_8_);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,mel._0_4_);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,mel._4_4_);
    poVar3 = std::operator<<(poVar3,"]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcen((Mat_<double> *)&etime2,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
         16000);
    iVar4 = NowTime<std::chrono::duration<long,std::ratio<1l,1000l>>>();
    poVar3 = std::operator<<((ostream *)&std::cout,"all2 cost: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4 - mel2._88_8_);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    cv::print((Mat *)&etime2,_stdout);
    ifile_length._4_4_ = 0;
    stime._0_4_ = 1;
    cv::Mat_<double>::~Mat_((Mat_<double> *)&etime2);
    cv::Mat_<double>::~Mat_((Mat_<double> *)&etime);
  }
  else {
    printf("It is no file: y.bin\n");
    ifile_length._4_4_ = -1;
    stime._0_4_ = 1;
  }
  std::fstream::~fstream(&local_240);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return ifile_length._4_4_;
}

Assistant:

int main() {
//    // 读取文件
//    Wav wav("raw.wav", nSamplesPerSec);
//    wav.WavToBuffer();
//    if (wav.thislabel == 1) {
//        std::cout << "wav.thislabel == 1" << std::endl;
//        return -1;
//    }
//    std::cout << "SampleRate: " << wav.waveformatex.SampleRate << " Hz" << std::endl;

    //我读取的wav数据和Python(librosa)读出来的不一样，深入检查未排查到原因。
    // 于是我将python里读取的wav数据保存了下来（张尚龙python代码读取的wav数据）
    // 现在载入该数据：
    unsigned long ifile_length = 0;
    std::vector<uint8_t> ifile_data; //wav数据
    std::fstream ifile("/home/toson/CLionProjects/MFCC/y.bin", std::ios::in);//使用python导出的wav数据
    if (ifile) {
        ifile.seekg(0, std::ios::end);                  // go to the end
        ifile_length = (unsigned long) ifile.tellg();   // report location (this is the length)
        ifile.seekg(0, std::ios::beg);                  // go back to the beginning
        ifile_data.resize(ifile_length, 0);
        ifile.read((char *) ifile_data.data(), ifile_length);
        ifile.close();
    } else {
        printf("It is no file: y.bin\n");
        return -1;
    }

    auto stime = NowTime<milliseconds>();
    // 运算mel特征向量 //11ms
    //auto mel = log_mel(ifile_data, 16000);
    auto mel = pcen(ifile_data, 16000);
    auto etime = NowTime<milliseconds>();
    std::cout << "all cost: " << etime - stime << std::endl;

    std::cout << "[" << mel.rows << ", " << mel.cols << "]" << std::endl;
//    cv::print(mel);

    // 首次运算会多使用5ms，生成mel滤波器用。
    //auto mel2 = log_mel(ifile_data, 16000);
    auto mel2 = pcen(ifile_data, 16000);
    auto etime2 = NowTime<milliseconds>();
    std::cout << "all2 cost: " << etime2 - etime << std::endl;
    cv::print(mel2);
//    for (int j = 0; j < mel2.rows; j++) {
//        for (int i = 0; i < mel2.cols; i++) {
//            std::cout << "[ " << j << " , " << i << " ]: " << mel2(j, i) << std::endl;
//        }
//    }
//    std::cout << std::endl;

    //保存为文件
//    std::fstream ofile("out_mel.csv", std::ios::out);
//    if (ofile) {
//        for (int i = 0; i < mel.shape().rows; i++) {
//            for (int j = 0; j < mel.shape().cols; j++) {
//                ofile << mel(i, j) << " ";
//            }
//            ofile << std::endl;
//        }
//        ofile.close();
//    }
//    std::cout << R"(Save as "out_mel.csv")" << std::endl;

    return 0;
}